

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O3

void __thiscall SparseArray<Value>::Set(SparseArray<Value> *this,uint32 index,Value *element)

{
  size_t requestedBytes;
  SAChunk<Value> *__s;
  ulong uVar1;
  SAChunk<Value> *pSVar2;
  uint uVar3;
  
  uVar1 = (ulong)this->chunkSize;
  pSVar2 = (SAChunk<Value> *)&this->firstChunk;
  while ((__s = pSVar2->next, __s != (SAChunk<Value> *)0x0 && (__s->startIndex <= index))) {
    pSVar2 = __s;
    if (index < __s->startIndex + this->chunkSize) {
LAB_00495105:
      (&__s[1].next)[(ulong)index % uVar1] = (SAChunk<Value> *)element;
      return;
    }
  }
  requestedBytes = uVar1 * 8 + 0x10;
  __s = (SAChunk<Value> *)
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                  (&this->alloc->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                   requestedBytes);
  memset(__s,0,requestedBytes);
  memset(&__s[1].next + uVar1,0,(uVar1 * 8 + 0x1f & 0xfffffffffffffff0) - requestedBytes);
  uVar3 = index - (int)((ulong)index % uVar1);
  __s->startIndex = uVar3;
  if (CARRY4(uVar3,this->chunkSize)) {
    Math::DefaultOverflowPolicy();
  }
  __s->next = pSVar2->next;
  pSVar2->next = __s;
  goto LAB_00495105;
}

Assistant:

void Set(uint32 index, T *element)
    {
        SAChunk<T> * chunk, **pPrev = &(this->firstChunk);
        uint32 indexInChunk = (index % this->chunkSize);

        for (chunk = this->firstChunk; chunk; chunk = chunk->next)
        {
            if (index < chunk->startIndex)
            {
                // Need a new chunk...
                chunk = NULL;
                break;
            }
            if (index < chunk->startIndex + this->chunkSize)
            {
                break;
            }
            pPrev = &(chunk->next);
        }

        if (chunk == NULL)
        {
            chunk = (SAChunk<T> *)this->alloc->AllocZero(sizeof(SAChunk<T>) + (chunkSize * sizeof(T *)));
            chunk->startIndex = index - indexInChunk;
            // Since startIndex and chunkSize don't change, check now if this overflows.
            // Cache the result or save memory ?
            UInt32Math::Add(chunk->startIndex, chunkSize);
            chunk->next = *pPrev;
            *pPrev = chunk;
        }
        chunk->data[indexInChunk] = element;
    }